

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

type * __thiscall
duckdb::Deserializer::
Read<std::unordered_map<std::__cxx11::string,duckdb::vector<duckdb::Value,true>,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>>>>
          (Deserializer *this)

{
  ulong uVar1;
  long *in_RSI;
  type *in_RDI;
  vector<duckdb::Value,_true> value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  idx_t i;
  idx_t size;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>_>
  *map;
  key_type *in_stack_ffffffffffffff68;
  type *this_00;
  char *in_stack_ffffffffffffff98;
  field_id_t in_stack_ffffffffffffffa6;
  Deserializer *in_stack_ffffffffffffffa8;
  ulong local_38;
  
  this_00 = in_RDI;
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>_>
                   *)0xb6062e);
  uVar1 = (**(code **)(*in_RSI + 0x40))();
  for (local_38 = 0; local_38 < uVar1; local_38 = local_38 + 1) {
    (**(code **)(*in_RSI + 0x30))();
    ReadProperty<std::__cxx11::string>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa6,in_stack_ffffffffffffff98);
    ReadProperty<duckdb::vector<duckdb::Value,true>>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa6,in_stack_ffffffffffffff98);
    (**(code **)(*in_RSI + 0x38))();
    in_stack_ffffffffffffff68 =
         (key_type *)
         ::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>_>
         ::operator[](this_00,in_stack_ffffffffffffff68);
    vector<duckdb::Value,_true>::operator=
              ((vector<duckdb::Value,_true> *)this_00,
               (vector<duckdb::Value,_true> *)in_stack_ffffffffffffff68);
    vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0xb606ea);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  }
  (**(code **)(*in_RSI + 0x48))();
  return in_RDI;
}

Assistant:

inline typename std::enable_if<is_unordered_map<T>::value, T>::type Read() {
		using KEY_TYPE = typename is_unordered_map<T>::KEY_TYPE;
		using VALUE_TYPE = typename is_unordered_map<T>::VALUE_TYPE;

		T map;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			OnObjectBegin();
			auto key = ReadProperty<KEY_TYPE>(0, "key");
			auto value = ReadProperty<VALUE_TYPE>(1, "value");
			OnObjectEnd();
			map[std::move(key)] = std::move(value);
		}
		OnListEnd();
		return map;
	}